

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scan.cpp
# Opt level: O0

void test_exclusive_scan<std::__cxx11::string,std::plus<std::__cxx11::string>>(uint W)

{
  code *pcVar1;
  byte extraout_AL;
  byte extraout_AL_00;
  reference this;
  pointer *__stat_loc;
  double __x;
  double __x_00;
  Expression_lhs<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
  EVar2;
  ResultBuilder DOCTEST_RB_1;
  ResultBuilder DOCTEST_RB;
  Task task2;
  Task alloc;
  Task task1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> init;
  size_t i;
  iterator dbeg;
  iterator send;
  iterator sbeg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  golden;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  input;
  size_t n;
  size_t limit;
  Taskflow taskflow;
  Executor executor;
  Result *in_stack_fffffffffffff9b8;
  Result *res;
  undefined4 in_stack_fffffffffffff9c0;
  Enum in_stack_fffffffffffff9c4;
  Executor *in_stack_fffffffffffff9c8;
  int line;
  undefined4 in_stack_fffffffffffff9d0;
  Enum in_stack_fffffffffffff9d4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_fffffffffffff9d8;
  Enum at;
  Taskflow *in_stack_fffffffffffff9e0;
  Executor *in_stack_fffffffffffff9f0;
  anon_class_32_4_6a670194 *c;
  undefined8 this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rhs;
  Executor *in_stack_fffffffffffffa48;
  ExpressionDecomposer local_5a4;
  Executor *local_5a0;
  Enum local_598;
  shared_ptr<tf::WorkerInterface> *in_stack_fffffffffffffaa8;
  char *in_stack_fffffffffffffab0;
  Executor *in_stack_fffffffffffffab8;
  ExpressionDecomposer local_4e4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_4e0;
  Enum local_4d8;
  ResultBuilder local_4b0;
  __basic_future<void> local_438 [2];
  string local_410 [32];
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_3f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_3e8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_3e0;
  FlowBuilder local_3d8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_3d0;
  Taskflow *local_3c8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_3c0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_3b8;
  string local_3a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_380;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_370;
  FlowBuilder local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_360;
  string local_350 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_328;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_320;
  undefined1 local_318 [32];
  anon_class_32_4_6a670194 local_2f8;
  string local_2d8 [32];
  FlowBuilder *local_2b8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2b0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a0 [10];
  Taskflow local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_150 [14];
  
  rhs = local_150;
  std::shared_ptr<tf::WorkerInterface>::shared_ptr
            ((shared_ptr<tf::WorkerInterface> *)
             CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),in_stack_fffffffffffff9b8
            );
  tf::Executor::Executor
            (in_stack_fffffffffffffab8,(size_t)in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8);
  std::shared_ptr<tf::WorkerInterface>::~shared_ptr((shared_ptr<tf::WorkerInterface> *)0x1848c2);
  tf::Taskflow::Taskflow(in_stack_fffffffffffff9e0);
  local_250._mutex.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x9c4;
  local_250._mutex.super___mutex_base._M_mutex._16_8_ = (FlowBuilder *)0x0;
  while( true ) {
    if (local_250._mutex.super___mutex_base._M_mutex.__data.__list.__prev <
        (ulong)local_250._mutex.super___mutex_base._M_mutex._16_8_) {
      tf::Taskflow::~Taskflow
                ((Taskflow *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
      tf::Executor::~Executor(in_stack_fffffffffffff9f0);
      return;
    }
    tf::Taskflow::clear((Taskflow *)0x18490c);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x18492b);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff9e0,(size_type)in_stack_fffffffffffff9d8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x184951);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x184970);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff9e0,(size_type)in_stack_fffffffffffff9d8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x184996);
    this_00 = local_250._mutex.super___mutex_base._M_mutex._16_8_;
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x1849b5);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff9e0,(size_type)in_stack_fffffffffffff9d8,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)0x1849db);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator(local_2a0);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator(&local_2a8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::__normal_iterator(&local_2b0);
    for (local_2b8 = (FlowBuilder *)0x0; at = (Enum)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
        local_2b8 < (ulong)local_250._mutex.super___mutex_base._M_mutex._16_8_;
        local_2b8 = (FlowBuilder *)((long)&local_2b8->_graph + 1)) {
      rand();
      std::__cxx11::to_string((int)((ulong)this_00 >> 0x20));
      this = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_250,(size_type)local_2b8);
      std::__cxx11::string::operator=((string *)this,local_2d8);
      std::__cxx11::string::~string(local_2d8);
    }
    std::__cxx11::string::string((string *)(local_318 + 0x20));
    rand();
    std::__cxx11::to_string((int)((ulong)this_00 >> 0x20));
    c = (anon_class_32_4_6a670194 *)(local_318 + 0x20);
    in_stack_fffffffffffff9f0 = (Executor *)local_318;
    std::__cxx11::string::operator=((string *)c,(string *)in_stack_fffffffffffff9f0);
    std::__cxx11::string::~string((string *)in_stack_fffffffffffff9f0);
    local_320 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff9b8);
    local_328 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff9b8);
    local_330 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff9b8);
    std::__cxx11::string::string(local_350,(string *)c);
    local_360 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                exclusive_scan<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string,std::plus<std::__cxx11::string>>
                          (local_320,local_328,local_330,local_350);
    std::__cxx11::string::~string(local_350);
    in_stack_fffffffffffff9e0 = &local_250;
    local_370 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff9b8);
    local_378 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffff9b8);
    local_380 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffff9b8);
    std::__cxx11::string::string(local_3a0,(string *)(local_318 + 0x20));
    tf::FlowBuilder::
    exclusive_scan<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::__cxx11::string,std::plus<std::__cxx11::string>>
              (&local_368,(undefined1 *)((long)&local_250._mutex.super___mutex_base._M_mutex + 0x20)
               ,local_370,local_378,local_380,local_3a0);
    std::__cxx11::string::~string(local_3a0);
    local_3d0 = local_2a0;
    local_3c8 = &local_250;
    local_3c0 = &local_2a8;
    local_3b8 = &local_2b0;
    tf::FlowBuilder::
    emplace<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_unittests_test_scan_cpp:306:35),_nullptr>
              ((FlowBuilder *)this_00,c);
    local_3e0 = (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)std::
                   ref<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff9b8);
    local_3e8 = (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)std::
                   ref<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff9b8);
    local_3f0 = (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)std::
                   ref<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                             ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)in_stack_fffffffffffff9b8);
    std::__cxx11::string::string(local_410,(string *)(local_318 + 0x20));
    tf::FlowBuilder::
    exclusive_scan<std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::reference_wrapper<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::__cxx11::string,std::plus<std::__cxx11::string>>
              (&local_3d8,(undefined1 *)((long)&local_250._mutex.super___mutex_base._M_mutex + 0x20)
               ,local_3e0,local_3e8,local_3f0,local_410);
    std::__cxx11::string::~string(local_410);
    tf::Task::precede<tf::Task&>
              ((Task *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (Task *)in_stack_fffffffffffff9b8);
    tf::Task::precede<tf::Task&>
              ((Task *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               (Task *)in_stack_fffffffffffff9b8);
    __stat_loc = &local_150[0].
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
    tf::Executor::run(in_stack_fffffffffffff9c8,
                      (Taskflow *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    line = (int)((ulong)in_stack_fffffffffffff9c8 >> 0x20);
    std::__basic_future<void>::wait(local_438,__stat_loc);
    tf::Future<void>::~Future
              ((Future<void> *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    res = (Result *)0x1b5e0d;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffff9e0,at,
               (char *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),line,
               (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),"",
               (char *)in_stack_fffffffffffff9f0);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_4e4,DT_REQUIRE);
    EVar2 = doctest::detail::ExpressionDecomposer::
            operator<<<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                      ((ExpressionDecomposer *)
                       CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)res);
    in_stack_fffffffffffff9d8 = EVar2.lhs;
    in_stack_fffffffffffff9d4 = EVar2.m_at;
    local_4e0 = in_stack_fffffffffffff9d8;
    local_4d8 = in_stack_fffffffffffff9d4;
    doctest::detail::
    Expression_lhs<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
    ::
    operator==<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
              ((Expression_lhs<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                *)in_stack_fffffffffffffa48,rhs);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),res);
    doctest::detail::Result::~Result((Result *)0x184f55);
    doctest::detail::ResultBuilder::log(&local_4b0,__x);
    in_stack_fffffffffffff9d0 = CONCAT13(extraout_AL,(int3)in_stack_fffffffffffff9d0);
    if ((extraout_AL & 1) != 0) break;
    doctest::detail::ResultBuilder::react
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1850dc);
    in_stack_fffffffffffff9b8 = (Result *)0x1b5e0d;
    doctest::detail::ResultBuilder::ResultBuilder
              ((ResultBuilder *)in_stack_fffffffffffff9e0,
               (Enum)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0),line,
               (char *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),"",
               (char *)in_stack_fffffffffffff9f0);
    doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_5a4,DT_REQUIRE);
    EVar2 = doctest::detail::ExpressionDecomposer::
            operator<<<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
                      ((ExpressionDecomposer *)
                       CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff9b8);
    in_stack_fffffffffffff9c8 = (Executor *)EVar2.lhs;
    in_stack_fffffffffffff9c4 = EVar2.m_at;
    in_stack_fffffffffffffa48 = in_stack_fffffffffffff9c8;
    local_5a0 = in_stack_fffffffffffff9c8;
    local_598 = in_stack_fffffffffffff9c4;
    doctest::detail::
    Expression_lhs<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
    ::
    operator==<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_nullptr>
              ((Expression_lhs<const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&>
                *)in_stack_fffffffffffff9c8,rhs);
    doctest::detail::ResultBuilder::setResult
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
               in_stack_fffffffffffff9b8);
    doctest::detail::Result::~Result((Result *)0x1851c1);
    doctest::detail::ResultBuilder::log((ResultBuilder *)&stack0xfffffffffffffa90,__x_00);
    in_stack_fffffffffffff9c0 = CONCAT13(extraout_AL_00,(int3)in_stack_fffffffffffff9c0);
    if ((extraout_AL_00 & 1) != 0) {
      pcVar1 = (code *)swi(3);
      (*pcVar1)();
      return;
    }
    doctest::detail::ResultBuilder::react
              ((ResultBuilder *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    doctest::detail::ResultBuilder::~ResultBuilder((ResultBuilder *)0x1852a0);
    std::__cxx11::string::~string((string *)(local_318 + 0x20));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)CONCAT44(in_stack_fffffffffffff9d4,in_stack_fffffffffffff9d0));
    local_250._mutex.super___mutex_base._M_mutex._16_8_ =
         local_250._mutex.super___mutex_base._M_mutex._16_8_ * 2 + 1;
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)();
  return;
}

Assistant:

void test_exclusive_scan(unsigned W) {
  
  tf::Executor executor(W);
  tf::Taskflow taskflow;

  size_t limit = std::is_same_v<T, std::string> ? 2500 : 250000;
  
  for(size_t n=0; n<=limit; n=n*2+1) {

    taskflow.clear();
    
    std::vector<T> input(n), output(n), golden(n); 
    typename std::vector<T>::iterator sbeg, send, dbeg;

    for(size_t i=0; i<n; i++) {
      if constexpr(std::is_same_v<T, std::string>) {
        input[i] = std::to_string(::rand() % 10);
      }
      else {
        input[i] = ::rand() % 10;
      }
    }
    
    T init;
    if constexpr(std::is_same_v<T, std::string>) {
      init = std::to_string(::rand() % 10);
    }
    else {
      init = ::rand() % 10;
    }

    std::exclusive_scan(
      input.begin(), input.end(), golden.begin(), init, B()
    );
    
    // out-of-place
    auto task1 = taskflow.exclusive_scan(
      input.begin(), input.end(), output.begin(), init, B()
    );  
    
    // enable stateful capture
    auto alloc = taskflow.emplace([&](){
      sbeg = input.begin();
      send = input.end();
      dbeg = input.begin();
    });
    
    // in-place
    auto task2 = taskflow.exclusive_scan(
      std::ref(sbeg), std::ref(send), std::ref(dbeg), init, B()
    );

    task1.precede(alloc);
    alloc.precede(task2);

    executor.run(taskflow).wait();

    REQUIRE(input == golden);
    REQUIRE(output == golden);
  }
}